

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O1

QByteArray * __thiscall
QJsonDocument::toJson(QByteArray *__return_storage_ptr__,QJsonDocument *this,JsonFormat format)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> other;
  long in_FS_OFFSET;
  QJsonValue result;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  other._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  if (&(other._M_head_impl)->value == (QCborValue *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QJsonValue::QJsonValue((QJsonValue *)local_48,Null);
    QCborValue::operator=((QCborValue *)local_48,&(other._M_head_impl)->value);
    QJsonValue::toJson(__return_storage_ptr__,(QJsonValue *)local_48,(uint)(format == Compact));
    QJsonValue::~QJsonValue((QJsonValue *)local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QJsonDocument::toJson(JsonFormat format) const
{
    QByteArray json;
    if (!d)
        return json;

    return QJsonPrivate::Value::fromTrustedCbor(d->value).toJson(
            format == JsonFormat::Compact ? QJsonValue::JsonFormat::Compact
                                          : QJsonValue::JsonFormat::Indented);
}